

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_transaction.cpp
# Opt level: O0

BlindingKeyResponseStruct *
cfd::js::api::ElementsTransactionStructApi::GetDefaultBlindingKey
          (BlindingKeyResponseStruct *__return_storage_ptr__,
          GetDefaultBlindingKeyRequestStruct *request)

{
  GetDefaultBlindingKeyRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetDefaultBlindingKeyRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetDefaultBlindingKeyRequestStruct *request_local;
  BlindingKeyResponseStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  BlindingKeyResponseStruct::BlindingKeyResponseStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::
  function<cfd::js::api::BlindingKeyResponseStruct(cfd::js::api::GetDefaultBlindingKeyRequestStruct_const&)>
  ::
  function<cfd::js::api::ElementsTransactionStructApi::GetDefaultBlindingKey(cfd::js::api::GetDefaultBlindingKeyRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::BlindingKeyResponseStruct(cfd::js::api::GetDefaultBlindingKeyRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetDefaultBlindingKey",&local_129);
  ExecuteStructApi<cfd::js::api::GetDefaultBlindingKeyRequestStruct,cfd::js::api::BlindingKeyResponseStruct>
            ((BlindingKeyResponseStruct *)(local_108 + 0x20),(api *)this,
             (GetDefaultBlindingKeyRequestStruct *)local_108,&local_128,in_R8);
  BlindingKeyResponseStruct::operator=
            (__return_storage_ptr__,(BlindingKeyResponseStruct *)(local_108 + 0x20));
  BlindingKeyResponseStruct::~BlindingKeyResponseStruct
            ((BlindingKeyResponseStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::
  function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&)>
  ::~function((function<cfd::js::api::BlindingKeyResponseStruct_(const_cfd::js::api::GetDefaultBlindingKeyRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

BlindingKeyResponseStruct ElementsTransactionStructApi::GetDefaultBlindingKey(
    const GetDefaultBlindingKeyRequestStruct& request) {
  auto call_func = [](const GetDefaultBlindingKeyRequestStruct& request)
      -> BlindingKeyResponseStruct {
    BlindingKeyResponseStruct response;
    Script locking_script;

    if (!request.address.empty() && request.locking_script.empty()) {
      ElementsAddressFactory factory;
      Address address = factory.GetAddress(request.address);
      locking_script = address.GetLockingScript();
    } else {
      locking_script = Script(request.locking_script);
    }
    Privkey blinding_key = ElementsConfidentialAddress::GetBlindingKey(
        Privkey(request.master_blinding_key), locking_script);

    response.blinding_key = blinding_key.GetHex();
    return response;
  };

  BlindingKeyResponseStruct result;
  result = ExecuteStructApi<
      GetDefaultBlindingKeyRequestStruct, BlindingKeyResponseStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}